

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intgemm.cc
# Opt level: O3

CPUType intgemm::GetCPUID(void)

{
  int iVar1;
  CPUType CVar2;
  CPUType CVar3;
  
  if (GetCPUID()::kLocalCPU == '\0') {
    iVar1 = __cxa_guard_acquire(&GetCPUID()::kLocalCPU);
    if (iVar1 != 0) {
      CVar2 = anon_unknown_15::RealCPUID();
      CVar3 = anon_unknown_15::EnvironmentCPUID();
      GetCPUID::kLocalCPU = CVar2;
      if (CVar3 < CVar2) {
        GetCPUID::kLocalCPU = CVar3;
      }
      __cxa_guard_release(&GetCPUID()::kLocalCPU);
    }
  }
  return GetCPUID::kLocalCPU;
}

Assistant:

CPUType GetCPUID() {
  static const CPUType kLocalCPU =
#ifdef INTGEMM_CPUID_ENVIRONMENT
    std::min(RealCPUID(), EnvironmentCPUID());
#else
    RealCPUID();
#endif
  return kLocalCPU;
}